

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QTransform * __thiscall QGraphicsView::viewportTransform(QGraphicsView *this)

{
  QGraphicsViewPrivate *pQVar1;
  qint64 qVar2;
  qint64 qVar3;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QTransform moveMatrix;
  QGraphicsViewPrivate *this_00;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = d_func((QGraphicsView *)0xa34945);
  memcpy(local_58,&DAT_00b482f8,0x50);
  qVar2 = QGraphicsViewPrivate::horizontalScroll(this_00);
  qVar3 = QGraphicsViewPrivate::verticalScroll(this_00);
  QTransform::fromTranslate((double)-qVar2,(double)-qVar3);
  if ((*(uint *)&pQVar1->field_0x300 >> 4 & 1) == 0) {
    QTransform::operator*((QTransform *)this_00,(QTransform *)&pQVar1->matrix);
  }
  else {
    memcpy(this_00,local_58,0x50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QTransform *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsView::viewportTransform() const
{
    Q_D(const QGraphicsView);
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    return d->identityMatrix ? moveMatrix : d->matrix * moveMatrix;
}